

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.h
# Opt level: O0

Polynom<Complex> * __thiscall
Polynom<Complex>::operator%=(Polynom<Complex> *this,Polynom<Complex> *a)

{
  Polynom<Complex> *pPVar1;
  Polynom<Complex> *in_RDI;
  Polynom<Complex> *unaff_retaddr;
  Polynom<Complex> *in_stack_00000008;
  Polynom<Complex> local_20 [2];
  
  pPVar1 = local_20;
  operator%(in_stack_00000008,unaff_retaddr);
  pPVar1 = operator=(pPVar1,in_RDI);
  ~Polynom((Polynom<Complex> *)0x18028a);
  return pPVar1;
}

Assistant:

inline Polynom &operator%=(const Polynom &a)
    {
        return *this = *this % a;
    }